

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O1

vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> *
__thiscall
soinn::ESOINN::getCenterOfCluster
          (vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,ESOINN *this,int classId)

{
  _List_node_base *p_Var1;
  _List_node_base *in_RAX;
  StoredVertex *sv;
  _List_node_base *p_Var2;
  double dVar3;
  
  p_Var2 = (this->graph).super_type.m_vertices.super__List_base<void_*,_std::allocator<void_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  dVar3 = -1.0;
  do {
    p_Var1 = p_Var2[1]._M_next;
    if ((*(int *)((long)(p_Var1 + 3) + 8) == classId) && (dVar3 < (double)p_Var1[4]._M_next)) {
      in_RAX = p_Var1;
      dVar3 = (double)p_Var1[4]._M_next;
    }
    p_Var2 = p_Var2->_M_next;
  } while (p_Var2 != (_List_node_base *)&(this->graph).super_type.m_vertices);
  boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::unbounded_array
            (&__return_storage_ptr__->data_,
             (unbounded_array<double,_std::allocator<double>_> *)(in_RAX + 2));
  return __return_storage_ptr__;
}

Assistant:

boost::numeric::ublas::vector<double> ESOINN::getCenterOfCluster(int classId)
{
    double density = -1;
    Vertex center;
    BGL_FORALL_VERTICES(v, graph, Graph) {
        if(graph[v].classId == classId && graph[v].density > density) {
            center = v;
            density = graph[center].density;
        }
    }
    return graph[center].weight;
}